

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_atrophy(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  char *txt;
  AFFECT_DATA af;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (bVar1) {
    if ((CHAR_DATA *)vo == ch) {
      txt = "You are already wasting away.\n\r";
    }
    else {
      txt = "They are already wasting away.\n\r";
    }
  }
  else {
    bVar1 = saves_spell(level,(CHAR_DATA *)vo,0x10);
    if (!bVar1) {
      bVar1 = str_cmp(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                      super__Vector_impl_data._M_start[*(short *)((long)vo + 0x136)].name,"troll");
      if (bVar1) {
        init_affect(&af);
        af.where = 0;
        af.aftype = 0;
        af.type = (short)sn;
        af.duration = (short)(level / 7);
        af.location = 0x1d;
        iVar2 = number_range(-3,level / -0xc);
        af.modifier = (short)iVar2;
        af.level = (short)level;
        af.mod_name = 0xf;
        affect_to_char((CHAR_DATA *)vo,&af);
        send_to_char("You feel an intense pain as your body begins to waste away.\n\r",
                     (CHAR_DATA *)vo);
        act("$n looks very sick as $s body starts wasting away before your eyes!",(CHAR_DATA *)vo,
            (void *)0x0,(void *)0x0,0);
        return;
      }
    }
    txt = "Spell failed.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_atrophy(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already wasting away.\n\r", ch);
		else
			send_to_char("They are already wasting away.\n\r", ch);

		return;
	}

	if (saves_spell(level, victim, DAM_OTHER) || !str_cmp(race_table[victim->race].name, "troll"))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.duration = level / 7;
	af.location = APPLY_REGENERATION;
	af.modifier = number_range(-3, -level / 12);
	af.level = level;
	af.mod_name = MOD_REGEN;
	affect_to_char(victim, &af);

	send_to_char("You feel an intense pain as your body begins to waste away.\n\r", victim);
	act("$n looks very sick as $s body starts wasting away before your eyes!", victim, nullptr, nullptr, TO_ROOM);
}